

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

TZDBNames * icu_63::TZDBNames::createInstance(UResourceBundle *rb,char *key)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  UResourceBundle *resB;
  UChar **buffer;
  UChar *pUVar4;
  UResourceBundle *resB_00;
  UChar **__s;
  TZDBNames *pTVar5;
  int32_t i;
  ulong uVar6;
  char *cs;
  UChar *pUVar7;
  long lVar8;
  UErrorCode status;
  int32_t len;
  UErrorCode local_48;
  int32_t local_44;
  UResourceBundle *local_40;
  UResourceBundle *local_38;
  
  if (key == (char *)0x0 || rb == (UResourceBundle *)0x0) {
    return (TZDBNames *)0x0;
  }
  if (*key == '\0') {
    return (TZDBNames *)0x0;
  }
  local_48 = U_ZERO_ERROR;
  local_44 = 0;
  resB = ures_getByKey_63(rb,key,(UResourceBundle *)0x0,&local_48);
  if (U_ZERO_ERROR < local_48) {
    return (TZDBNames *)0x0;
  }
  buffer = (UChar **)uprv_malloc_63(0x10);
  if (buffer == (UChar **)0x0) {
    return (TZDBNames *)0x0;
  }
  bVar1 = true;
  lVar8 = 0;
  do {
    local_48 = U_ZERO_ERROR;
    pUVar4 = ures_getStringByKey_63
                       (resB,(char *)((long)&_ZN6icu_63L14TZDBNAMES_KEYSE_rel +
                                     (long)*(int *)((long)&_ZN6icu_63L14TZDBNAMES_KEYSE_rel + lVar8)
                                     ),&local_44,&local_48);
    pUVar7 = (UChar *)0x0;
    if (local_44 != 0 && local_48 < U_ILLEGAL_ARGUMENT_ERROR) {
      bVar1 = false;
      pUVar7 = pUVar4;
    }
    *(UChar **)((long)buffer + lVar8 * 2) = pUVar7;
    lVar8 = lVar8 + 4;
  } while (lVar8 == 4);
  if (bVar1) {
    if (buffer == (UChar **)0x0) {
      return (TZDBNames *)0x0;
    }
  }
  else {
    cs = "parseRegions";
    uVar3 = 0;
    resB_00 = ures_getByKey_63(resB,"parseRegions",(UResourceBundle *)0x0,&local_48);
    bVar1 = true;
    if (local_48 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_40 = resB_00;
      uVar3 = ures_getSize_63(resB_00);
      if (((int)uVar3 < 1) ||
         (__s = (UChar **)uprv_malloc_63((ulong)uVar3 * 8), __s == (UChar **)0x0)) {
        __s = (UChar **)0x0;
        resB_00 = local_40;
      }
      else {
        uVar6 = 0;
        local_38 = resB;
        memset(__s,0,(ulong)uVar3 << 3);
        bVar1 = false;
        do {
          local_48 = U_ZERO_ERROR;
          pUVar7 = (UChar *)(uVar6 & 0xffffffff);
          pUVar4 = ures_getStringByIndex_63(local_40,(int32_t)uVar6,&local_44,&local_48);
          if (local_48 < U_ILLEGAL_ARGUMENT_ERROR) {
            cs = (char *)uprv_malloc_63((long)local_44 + 1);
            __s[uVar6] = (UChar *)cs;
            if ((UChar *)cs == (UChar *)0x0) goto LAB_00205879;
            u_UCharsToChars_63(pUVar4,cs,local_44);
            *(undefined1 *)((long)__s[uVar6] + (long)local_44) = 0;
            bVar2 = true;
          }
          else {
LAB_00205879:
            cs = (char *)pUVar7;
            bVar2 = false;
            bVar1 = true;
          }
        } while ((bVar2) && (uVar6 = uVar6 + 1, (int)uVar6 < (int)uVar3));
        bVar1 = !bVar1;
        resB_00 = local_40;
        resB = local_38;
      }
    }
    else {
      __s = (UChar **)0x0;
    }
    ures_close_63(resB_00);
    ures_close_63(resB);
    if (bVar1) {
      pTVar5 = (TZDBNames *)UMemory::operator_new((UMemory *)0x20,(size_t)cs);
      if (pTVar5 == (TZDBNames *)0x0) {
        return (TZDBNames *)0x0;
      }
      pTVar5->_vptr_TZDBNames = (_func_int **)&PTR__TZDBNames_003d4d90;
      pTVar5->fNames = buffer;
      pTVar5->fRegions = (char **)__s;
      pTVar5->fNumRegions = uVar3;
      return pTVar5;
    }
    if (buffer != (UChar **)0x0) {
      uprv_free_63(buffer);
    }
    if (__s == (UChar **)0x0) {
      return (TZDBNames *)0x0;
    }
    buffer = __s;
    if (0 < (int)uVar3) {
      lVar8 = 0;
      do {
        uprv_free_63(__s[lVar8]);
        lVar8 = lVar8 + 1;
      } while (uVar3 != (uint)lVar8);
    }
  }
  uprv_free_63(buffer);
  return (TZDBNames *)0x0;
}

Assistant:

TZDBNames*
TZDBNames::createInstance(UResourceBundle* rb, const char* key) {
    if (rb == NULL || key == NULL || *key == 0) {
        return NULL;
    }

    UErrorCode status = U_ZERO_ERROR;

    const UChar **names = NULL;
    char** regions = NULL;
    int32_t numRegions = 0;

    int32_t len = 0;

    UResourceBundle* rbTable = NULL;
    rbTable = ures_getByKey(rb, key, rbTable, &status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    names = (const UChar **)uprv_malloc(sizeof(const UChar*) * TZDBNAMES_KEYS_SIZE);
    UBool isEmpty = TRUE;
    if (names != NULL) {
        for (int32_t i = 0; i < TZDBNAMES_KEYS_SIZE; i++) {
            status = U_ZERO_ERROR;
            const UChar *value = ures_getStringByKey(rbTable, TZDBNAMES_KEYS[i], &len, &status);
            if (U_FAILURE(status) || len == 0) {
                names[i] = NULL;
            } else {
                names[i] = value;
                isEmpty = FALSE;
            }
        }
    }

    if (isEmpty) {
        if (names != NULL) {
            uprv_free(names);
        }
        return NULL;
    }

    UResourceBundle *regionsRes = ures_getByKey(rbTable, "parseRegions", NULL, &status);
    UBool regionError = FALSE;
    if (U_SUCCESS(status)) {
        numRegions = ures_getSize(regionsRes);
        if (numRegions > 0) {
            regions = (char**)uprv_malloc(sizeof(char*) * numRegions);
            if (regions != NULL) {
                char **pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    *pRegion = NULL;
                }
                // filling regions
                pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    status = U_ZERO_ERROR;
                    const UChar *uregion = ures_getStringByIndex(regionsRes, i, &len, &status);
                    if (U_FAILURE(status)) {
                        regionError = TRUE;
                        break;
                    }
                    *pRegion = (char*)uprv_malloc(sizeof(char) * (len + 1));
                    if (*pRegion == NULL) {
                        regionError = TRUE;
                        break;
                    }
                    u_UCharsToChars(uregion, *pRegion, len);
                    (*pRegion)[len] = 0;
                }
            }
        }
    }
    ures_close(regionsRes);
    ures_close(rbTable);

    if (regionError) {
        if (names != NULL) {
            uprv_free(names);
        }
        if (regions != NULL) {
            char **p = regions;
            for (int32_t i = 0; i < numRegions; p++, i++) {
                uprv_free(*p);
            }
            uprv_free(regions);
        }
        return NULL;
    }

    return new TZDBNames(names, regions, numRegions);
}